

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.hpp
# Opt level: O3

void __thiscall
cs::instance_type::instance_type
          (instance_type *this,context_t *c,stack_pointer *fsp,size_t stack_size)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  runtime_type::runtime_type(&this->super_runtime_type,fsp,stack_size);
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->statements).super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_M_initialize_map
            (&(this->statements).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>,0);
  this->fiber_sp = (stack_pointer)0x0;
  this->fiber_stack = fsp;
  this->return_fcall = false;
  this->break_block = false;
  this->continue_block = false;
  (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  (c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  return;
}

Assistant:

instance_type(context_t c, stack_pointer &fsp, std::size_t stack_size) : context(std::move(c)), runtime_type(fsp, stack_size), fiber_stack(fsp) {}